

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O0

rfc5444_writer_address *
rfc5444_writer_add_address
          (rfc5444_writer *writer,rfc5444_writer_message *msg,netaddr *naddr,_Bool mandatory)

{
  list_entity *plVar1;
  uint8_t uVar2;
  avl_node *paVar3;
  list_entity *plVar4;
  rfc5444_writer_address *local_a0;
  rfc5444_writer_address *local_98;
  rfc5444_writer_address *address;
  _Bool mandatory_local;
  netaddr *naddr_local;
  rfc5444_writer_message *msg_local;
  rfc5444_writer *writer_local;
  
  if (writer->_state != RFC5444_WRITER_ADD_ADDRESSES) {
    __assert_fail("writer->_state == RFC5444_WRITER_ADD_ADDRESSES",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0xf3,
                  "struct rfc5444_writer_address *rfc5444_writer_add_address(struct rfc5444_writer *, struct rfc5444_writer_message *, const struct netaddr *, _Bool)"
                 );
  }
  paVar3 = avl_find(&msg->_addr_tree,naddr);
  if (paVar3 == (avl_node *)0x0) {
    local_a0 = (rfc5444_writer_address *)0x0;
  }
  else {
    local_a0 = (rfc5444_writer_address *)(paVar3 + -1);
  }
  local_98 = local_a0;
  if (local_a0 == (rfc5444_writer_address *)0x0) {
    local_98 = (*writer->malloc_address_entry)();
    if (local_98 == (rfc5444_writer_address *)0x0) {
      return (rfc5444_writer_address *)0x0;
    }
    *(undefined8 *)(local_98->address)._addr = *(undefined8 *)naddr->_addr;
    *(undefined8 *)((local_98->address)._addr + 8) = *(undefined8 *)(naddr->_addr + 8);
    uVar2 = naddr->_prefix_len;
    (local_98->address)._type = naddr->_type;
    (local_98->address)._prefix_len = uVar2;
    if (mandatory) {
      plVar4 = &local_98->_addr_list_node;
      plVar1 = (msg->_addr_head).prev;
      plVar4->next = &msg->_addr_head;
      (local_98->_addr_list_node).prev = plVar1;
      (msg->_addr_head).prev = plVar4;
      plVar1->next = plVar4;
    }
    else {
      plVar4 = &local_98->_addr_list_node;
      plVar1 = (msg->_non_mandatory_addr_head).prev;
      plVar4->next = &msg->_non_mandatory_addr_head;
      (local_98->_addr_list_node).prev = plVar1;
      (msg->_non_mandatory_addr_head).prev = plVar4;
      plVar1->next = plVar4;
    }
    (local_98->_addr_tree_node).key = &local_98->address;
    avl_insert(&msg->_addr_tree,&local_98->_addr_tree_node);
    avl_init(&local_98->_addrtlv_tree,avl_comp_uint32,true);
  }
  local_98->_mandatory_addr = (local_98->_mandatory_addr & 1U) != 0 || mandatory;
  return local_98;
}

Assistant:

struct rfc5444_writer_address *
rfc5444_writer_add_address(struct rfc5444_writer *writer __attribute__((unused)), struct rfc5444_writer_message *msg,
  const struct netaddr *naddr, bool mandatory) {
  struct rfc5444_writer_address *address;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_ADD_ADDRESSES);
#endif

  address = avl_find_element(&msg->_addr_tree, naddr, address, _addr_tree_node);
  if (address == NULL) {
    if ((address = writer->malloc_address_entry()) == NULL) {
      return NULL;
    }

    memcpy(&address->address, naddr, sizeof(*naddr));

    /* add address to address list */
    if (mandatory) {
      list_add_tail(&msg->_addr_head, &address->_addr_list_node);
    }
    else {
      list_add_tail(&msg->_non_mandatory_addr_head, &address->_addr_list_node);
    }

    /* add address into message address tree */
    address->_addr_tree_node.key = &address->address;
    avl_insert(&msg->_addr_tree, &address->_addr_tree_node);

    avl_init(&address->_addrtlv_tree, avl_comp_uint32, true);
  }

  address->_mandatory_addr |= mandatory;

  return address;
}